

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O3

int __thiscall QTemporaryFilePrivate::rename(QTemporaryFilePrivate *this,char *__old,char *__new)

{
  QObject *this_00;
  QAbstractFileEngine *this_01;
  QAbstractFileEnginePrivate *pQVar1;
  char cVar2;
  FileError FVar3;
  QString *pQVar5;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  int iVar4;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QFilePrivate).super_QFileDevicePrivate.super_QIODevicePrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  this_01 = (this->super_QFilePrivate).super_QFileDevicePrivate.fileEngine._M_t.
            super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
            _M_t.
            super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
            .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (this_01 != (QAbstractFileEngine *)0x0) {
    pQVar1 = (this_01->d_ptr).d;
    if (((pQVar1[3].errorString.d.ptr != (char16_t *)0x0) || (*(int *)&pQVar1[3].q_ptr != -1)) &&
       (*(char *)((long)&this_01[2]._vptr_QAbstractFileEngine + 1) != '\0')) {
      QFileDevice::unsetError((QFileDevice *)this_00);
      (*(((QFileDevice *)&this_00->_vptr_QObject)->super_QIODevice).super_QObject._vptr_QObject[0xe]
      )(this_00);
      FVar3 = QFileDevice::error((QFileDevice *)this_00);
      if (FVar3 == NoError) {
        if ((char)__new == '\0') {
          iVar4 = (*this_01->_vptr_QAbstractFileEngine[0xc])(this_01,__old);
          cVar2 = (char)iVar4;
        }
        else {
          iVar4 = (*this_01->_vptr_QAbstractFileEngine[0xd])();
          cVar2 = (char)iVar4;
        }
        if (cVar2 == '\0') {
          QAbstractFileEngine::errorString(&local_48,this_01);
          QFileDevicePrivate::setError((QFileDevicePrivate *)this,RenameError,&local_48);
          if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
            }
          }
          goto LAB_0025a62d;
        }
        QFileDevice::unsetError((QFileDevice *)this_00);
        pQVar5 = QString::operator=(&(this->super_QFilePrivate).fileName,(QString *)__old);
        iVar4 = (int)CONCAT71((int7)((ulong)pQVar5 >> 8),1);
      }
      else {
LAB_0025a62d:
        iVar4 = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return iVar4;
      }
      goto LAB_0025a733;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    iVar4 = QFile::rename((QFile *)this_00,__old,__new);
    return iVar4;
  }
LAB_0025a733:
  __stack_chk_fail();
}

Assistant:

bool QTemporaryFilePrivate::rename(const QString &newName, bool overwrite)
{
    Q_Q(QTemporaryFile);
    auto tef = static_cast<QTemporaryFileEngine *>(fileEngine.get());
    if (!tef || !tef->isReallyOpen() || !tef->filePathWasTemplate)
        return q->QFile::rename(newName);

    q->unsetError();
    q->close();
    if (q->error() == QFile::NoError) {
        if (overwrite ? tef->renameOverwrite(newName) : tef->rename(newName)) {
            q->unsetError();
            // engine was able to handle the new name so we just reset it
            fileName = newName;
            return true;
        }

        setError(QFile::RenameError, tef->errorString());
    }
    return false;
}